

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlListMerge(void)

{
  int iVar1;
  int iVar2;
  xmlListPtr val;
  xmlListPtr val_00;
  int local_2c;
  int n_l2;
  xmlListPtr l2;
  int n_l1;
  xmlListPtr l1;
  int mem_base;
  int test_ret;
  
  l1._4_4_ = 0;
  for (l2._4_4_ = 0; (int)l2._4_4_ < 2; l2._4_4_ = l2._4_4_ + 1) {
    for (local_2c = 0; local_2c < 2; local_2c = local_2c + 1) {
      iVar1 = xmlMemBlocks();
      val = gen_xmlListPtr(l2._4_4_,0);
      val_00 = gen_xmlListPtr(local_2c,1);
      xmlListMerge(val,val_00);
      call_tests = call_tests + 1;
      des_xmlListPtr(l2._4_4_,val,0);
      des_xmlListPtr(local_2c,val_00,1);
      xmlResetLastError();
      iVar2 = xmlMemBlocks();
      if (iVar1 != iVar2) {
        iVar2 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlListMerge",(ulong)(uint)(iVar2 - iVar1));
        l1._4_4_ = l1._4_4_ + 1;
        printf(" %d",(ulong)l2._4_4_);
        printf(" %d");
        printf("\n");
      }
    }
  }
  function_tests = function_tests + 1;
  return l1._4_4_;
}

Assistant:

static int
test_xmlListMerge(void) {
    int test_ret = 0;

    int mem_base;
    xmlListPtr l1; /* the original list */
    int n_l1;
    xmlListPtr l2; /* the new list */
    int n_l2;

    for (n_l1 = 0;n_l1 < gen_nb_xmlListPtr;n_l1++) {
    for (n_l2 = 0;n_l2 < gen_nb_xmlListPtr;n_l2++) {
        mem_base = xmlMemBlocks();
        l1 = gen_xmlListPtr(n_l1, 0);
        l2 = gen_xmlListPtr(n_l2, 1);

        xmlListMerge(l1, l2);
        call_tests++;
        des_xmlListPtr(n_l1, l1, 0);
        des_xmlListPtr(n_l2, l2, 1);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlListMerge",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_l1);
            printf(" %d", n_l2);
            printf("\n");
        }
    }
    }
    function_tests++;

    return(test_ret);
}